

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O3

void CoreML::Specification::CoreMLModels::protobuf_WordEmbedding_2eproto::AddDescriptors(void)

{
  FunctionClosure0 func;
  FunctionClosure0 local_20;
  
  if (AddDescriptors::once != 2) {
    local_20.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_003c62a0;
    local_20.function_ = AddDescriptorsImpl;
    local_20.self_deleting_ = false;
    google::protobuf::GoogleOnceInitImpl(&AddDescriptors::once,&local_20.super_Closure);
    google::protobuf::internal::FunctionClosure0::~FunctionClosure0(&local_20);
  }
  return;
}

Assistant:

size_t WordEmbedding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  size_t total_size = 0;

  // string language = 10;
  if (this->language().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->language());
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->modelparameterdata());
  }

  // uint32 revision = 1;
  if (this->revision() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->revision());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}